

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O3

Vector<long_double> * __thiscall
Vector<long_double>::operator=(Vector<long_double> *this,longdouble *val)

{
  longdouble lVar1;
  uint uVar2;
  longdouble *plVar3;
  long *plVar4;
  size_t sVar5;
  long lVar6;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  uVar2 = this->num_elts;
  if ((ulong)uVar2 == 0) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "Vector< T >& Vector< T >::operator = (const T& val), unallocated vector","");
    plVar4 = local_38;
    if (local_30 != 0) {
      if (local_38 == (long *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a342a8);
      }
      else {
        sVar5 = strlen((char *)local_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)plVar4,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
    }
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  else if (0 < (int)uVar2) {
    plVar3 = this->ptr_to_data;
    lVar1 = *val;
    lVar6 = 0;
    do {
      *(longdouble *)((long)plVar3 + lVar6) = lVar1;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)uVar2 << 4 != lVar6);
  }
  return this;
}

Assistant:

Vector< T >& Vector< T >::operator = (const T& val)
{
  if (num_elts != 0)
    for (int i=0; i<num_elts; ++i)
      ptr_to_data[i] = val;
  else error("Vector< T >& Vector< T >::operator = (const T& val), unallocated vector");

  return *this;
}